

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

void QUtil::analyze_encoding(string *val,bool *has_8bit_chars,bool *is_valid_utf8,bool *is_utf16)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  bool error;
  size_t pos;
  bool local_41;
  size_t local_40;
  bool *local_38;
  
  *is_valid_utf8 = false;
  *is_utf16 = false;
  *has_8bit_chars = false;
  bVar3 = QUtil::is_utf16(val);
  if (bVar3) {
    *has_8bit_chars = true;
    *is_utf16 = true;
  }
  else {
    uVar1 = val->_M_string_length;
    local_40 = 0;
    if (uVar1 == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      local_38 = is_valid_utf8;
      do {
        sVar2 = local_40;
        local_41 = false;
        get_next_utf8_codepoint(val,&local_40,&local_41);
        if (local_41 != false) {
          bVar3 = true;
        }
        if ((1 < local_40 - sVar2) || ((val->_M_dataplus)._M_p[sVar2] < '\0')) {
          *has_8bit_chars = true;
        }
        is_valid_utf8 = local_38;
      } while (local_40 < uVar1);
    }
    if ((*has_8bit_chars == true) && (!bVar3)) {
      *is_valid_utf8 = true;
    }
  }
  return;
}

Assistant:

void
QUtil::analyze_encoding(
    std::string const& val, bool& has_8bit_chars, bool& is_valid_utf8, bool& is_utf16)
{
    has_8bit_chars = is_utf16 = is_valid_utf8 = false;
    if (QUtil::is_utf16(val)) {
        has_8bit_chars = true;
        is_utf16 = true;
        return;
    }
    size_t len = val.length();
    size_t pos = 0;
    bool any_errors = false;
    while (pos < len) {
        bool error = false;
        auto o_pos = pos;
        get_next_utf8_codepoint(val, pos, error);
        if (error) {
            any_errors = true;
        }
        if (pos - o_pos > 1 || val[o_pos] & 0x80) {
            has_8bit_chars = true;
        }
    }
    if (has_8bit_chars && (!any_errors)) {
        is_valid_utf8 = true;
    }
}